

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

void __thiscall
lzham::search_accelerator::find_all_matches_callback
          (search_accelerator *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  uint *puVar4;
  ulong uVar5;
  dict_match *__dest;
  long *plVar6;
  node *pnVar7;
  uint in_ESI;
  undefined8 *in_RDI;
  uint insert_pos_1;
  uint match_ref_ofs;
  uint num_matches_to_write;
  uint num_matches;
  uint new_pos;
  uint new_mismatch_dist;
  uint new_mismatch_byte;
  uint cur_mismatch_dist;
  uint cur_mismatch_byte;
  uint desired_mismatch_byte;
  uint compMatchOfs;
  uint compMatchSlot;
  uint bestMatchSlotOfs;
  uint bestMatchSlot;
  uint compMatchDist;
  uint bestMatchDist;
  uint alt_match_len;
  uint64 *pIns_cur;
  uint64 *pComp_cur;
  uint64 *pComp_end;
  uint8 *pComp;
  uint match_len;
  node *pNode;
  uint pos;
  uint delta_pos;
  uint n;
  uint8 *pIns;
  uint best_match_len;
  uint max_match_len;
  uint *pRight;
  uint *pLeft;
  uint cur_pos;
  dict_match *pDstMatch;
  uint h;
  uint c2;
  uint insert_pos;
  uint8 *pDict;
  uint c1;
  uint c0;
  uint fill_lookahead_size;
  uint fill_dict_size;
  uint fill_lookahead_pos;
  dict_match temp_matches [256];
  uint thread_index;
  scoped_perf_section find_all_matches_timer;
  uint local_624;
  uint local_620;
  uint local_5fc;
  uint local_5e4;
  uint local_5e0;
  uint local_5dc;
  uint local_5d8;
  uint local_5d4;
  uint local_5d0;
  uint local_5cc;
  long *local_5c8;
  long *local_5c0;
  long *local_5b8;
  long *local_5b0;
  uint local_5a4;
  node *local_5a0;
  uint local_594;
  uint local_590;
  int local_58c;
  long *local_588;
  uint local_580;
  uint local_57c;
  node *local_578;
  node *local_570;
  uint local_564;
  uint *local_560;
  uint local_554;
  uint local_550;
  uint local_54c;
  uchar *local_548;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528 [322];
  uint local_20;
  scoped_perf_section local_19 [9];
  uint local_10;
  
  local_10 = in_ESI;
  scoped_perf_section::scoped_perf_section(local_19,"find_all_matches_callback");
  local_20 = local_10;
  local_52c = *(uint *)(in_RDI + 0x15);
  local_530 = *(uint *)(in_RDI + 0x16);
  local_534 = *(uint *)((long)in_RDI + 0xac);
  local_538 = 0;
  local_53c = 0;
  if (1 < local_534) {
    pbVar3 = vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)(in_RDI + 5),local_52c & *(uint *)(in_RDI + 3));
    local_538 = (uint)*pbVar3;
    pbVar3 = vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)(in_RDI + 5),
                        (local_52c & *(uint *)(in_RDI + 3)) + 1);
    local_53c = (uint)*pbVar3;
  }
  local_548 = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)(in_RDI + 5));
  do {
    while( true ) {
      if (local_534 < 3) {
        for (; local_534 != 0; local_534 = local_534 - 1) {
          uVar2 = local_52c & *(uint *)(in_RDI + 3);
          pnVar7 = vector<lzham::node>::operator[]((vector<lzham::node> *)(in_RDI + 9),uVar2);
          pnVar7->m_left = 0;
          pnVar7 = vector<lzham::node>::operator[]((vector<lzham::node> *)(in_RDI + 9),uVar2);
          pnVar7->m_right = 0;
          plVar6 = vector<long>::operator[]
                             ((vector<long> *)(in_RDI + 0xd),local_52c - *(int *)(in_RDI + 0x15));
          atomic_exchange32(plVar6,-2);
          local_52c = local_52c + 1;
          local_530 = local_530 + 1;
        }
        atomic_increment32(in_RDI + 0x19);
        return;
      }
      local_54c = local_52c & *(uint *)(in_RDI + 3);
      local_550 = (uint)local_548[local_54c + 2];
      local_554 = hash3_to_16(local_538,local_53c,local_550);
      local_538 = local_53c;
      local_53c = local_550;
      uVar1 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0xf));
      if ((uVar1 == 0) ||
         (pbVar3 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)(in_RDI + 0xf),local_554),
         *pbVar3 == local_20)) break;
      local_52c = local_52c + 1;
      local_534 = local_534 - 1;
      local_530 = local_530 + 1;
    }
    local_560 = local_528;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 7),local_554);
    uVar2 = local_52c;
    local_564 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 7),local_554);
    *puVar4 = uVar2;
    local_570 = vector<lzham::node>::operator[]((vector<lzham::node> *)(in_RDI + 9),local_54c);
    local_578 = vector<lzham::node>::operator[]((vector<lzham::node> *)(in_RDI + 9),local_54c);
    local_578 = (node *)&local_578->m_right;
    if (local_534 < 0x102) {
      local_620 = local_534;
    }
    else {
      local_620 = 0x101;
    }
    local_57c = local_620;
    local_580 = 2;
    local_588 = (long *)(local_548 + local_54c);
    local_58c = *(int *)((long)in_RDI + 0xb4);
    while( true ) {
      local_590 = local_52c - local_564;
      if (((local_58c == 0) || (local_590 == 0)) || (local_530 <= local_590)) break;
      local_594 = local_564 & *(uint *)(in_RDI + 3);
      local_58c = local_58c + -1;
      local_5a0 = vector<lzham::node>::operator[]((vector<lzham::node> *)(in_RDI + 9),local_594);
      local_5b0 = (long *)(local_548 + local_594);
      local_5b8 = (long *)((long)local_5b0 + ((ulong)local_57c - 7));
      local_5c8 = local_588;
      for (local_5c0 = local_5b0; (local_5c0 < local_5b8 && (*local_5c0 == *local_5c8));
          local_5c0 = local_5c0 + 1) {
        local_5c8 = local_5c8 + 1;
      }
      for (local_5cc = (int)local_5c0 - (int)local_5b0;
          (local_5cc < local_57c &&
          (*(char *)((long)local_5b0 + (ulong)local_5cc) ==
           *(char *)((long)local_588 + (ulong)local_5cc))); local_5cc = local_5cc + 1) {
      }
      local_5a4 = local_5cc;
      if (local_580 < local_5cc) {
        *(char *)(local_560 + 1) = (char)local_5cc + -2;
        *local_560 = local_590;
        local_560 = (uint *)((long)local_560 + 5);
        local_580 = local_5cc;
        if (local_5cc == local_57c) {
          local_570->m_left = local_5a0->m_left;
          local_578->m_left = local_5a0->m_right;
          goto LAB_0011a50b;
        }
      }
      else if ((*(byte *)((long)in_RDI + 0xbc) & 1) == 0) {
        if ((2 < local_580) && (local_580 == local_5cc)) {
          local_5d0 = *(uint *)((long)local_560 + -5);
          local_5d4 = local_590;
          CLZBase::compute_lzx_position_slot((CLZBase *)*in_RDI,local_5d0,&local_5d8,&local_5dc);
          CLZBase::compute_lzx_position_slot((CLZBase *)*in_RDI,local_5d4,&local_5e0,&local_5e4);
          if ((local_5e0 < local_5d8) ||
             (((7 < local_5e0 && (local_5e0 == local_5d8)) &&
              ((local_5e4 & 0xf) < (local_5dc & 0xf))))) {
            *(uint *)((long)local_560 + -5) = local_590;
          }
          else if (((local_5a4 < local_57c) && (local_5e0 <= local_5d8)) &&
                  ((byte)g_hamming_dist
                         [*(byte *)((long)local_5b0 + (ulong)local_5a4) ^
                          *(byte *)((long)local_588 + (ulong)local_5a4)] <
                   (byte)g_hamming_dist
                         [local_548[(local_54c - local_5d0) + local_5a4 & *(uint *)(in_RDI + 3)] ^
                          *(byte *)((long)local_588 + (ulong)local_5a4)])) {
            *(uint *)((long)local_560 + -5) = local_590;
          }
        }
      }
      else {
        *(char *)(local_560 + 1) = (char)local_5cc + -2;
        *local_560 = local_590;
        local_560 = (uint *)((long)local_560 + 5);
      }
      if (*(byte *)((long)local_5b0 + (ulong)local_5a4) <
          *(byte *)((long)local_588 + (ulong)local_5a4)) {
        local_570->m_left = local_564;
        local_570 = (node *)&local_5a0->m_right;
        local_5fc = local_5a0->m_right;
      }
      else {
        local_578->m_left = local_564;
        local_578 = local_5a0;
        local_5fc = local_5a0->m_left;
      }
      if (local_5fc == local_564) goto LAB_0011a50b;
      local_564 = local_5fc;
    }
    local_570->m_left = 0;
    local_578->m_left = 0;
    local_58c = local_58c + -1;
LAB_0011a50b:
    uVar2 = (uint)(((long)local_560 - (long)local_528) / 5);
    if (uVar2 == 0) {
      plVar6 = vector<long>::operator[]
                         ((vector<long> *)(in_RDI + 0xd),local_52c - *(int *)(in_RDI + 0x15));
      atomic_exchange32(plVar6,-2);
    }
    else {
      *(uint *)((long)local_560 + -5) = *(uint *)((long)local_560 + -5) | 0x80000000;
      local_624 = uVar2;
      if (*(uint *)(in_RDI + 0x17) <= uVar2) {
        local_624 = *(uint *)(in_RDI + 0x17);
      }
      uVar5 = atomic_exchange_add(in_RDI + 0x18,(ulong)local_624);
      __dest = vector<lzham::dict_match>::operator[]
                         ((vector<lzham::dict_match> *)(in_RDI + 0xb),(uint)uVar5);
      memcpy(__dest,(void *)((long)local_528 + (ulong)(uVar2 - local_624) * 5),(ulong)local_624 * 5)
      ;
      plVar6 = vector<long>::operator[]
                         ((vector<long> *)(in_RDI + 0xd),local_52c - *(int *)(in_RDI + 0x15));
      atomic_exchange32(plVar6,uVar5 & 0xffffffff);
    }
    local_52c = local_52c + 1;
    local_534 = local_534 - 1;
    local_530 = local_530 + 1;
  } while( true );
}

Assistant:

void search_accelerator::find_all_matches_callback(uint64 data, void* pData_ptr)
   {
      scoped_perf_section find_all_matches_timer("find_all_matches_callback");

      pData_ptr;
      const uint thread_index = (uint)data;

      dict_match temp_matches[cMatchAccelMaxSupportedProbes * 2];

      uint fill_lookahead_pos = m_fill_lookahead_pos;
      uint fill_dict_size = m_fill_dict_size;
      uint fill_lookahead_size = m_fill_lookahead_size;

      uint c0 = 0, c1 = 0;
      if (fill_lookahead_size >= 2)
      {
         c0 = m_dict[fill_lookahead_pos & m_max_dict_size_mask];
         c1 = m_dict[(fill_lookahead_pos & m_max_dict_size_mask) + 1];
      }

      const uint8* pDict = m_dict.get_ptr();

      while (fill_lookahead_size >= 3)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;

         uint c2 = pDict[insert_pos + 2];
         uint h = hash3_to_16(c0, c1, c2);
         c0 = c1;
         c1 = c2;

         LZHAM_ASSERT(!m_hash_thread_index.size() || (m_hash_thread_index[h] != UINT8_MAX));

         // Only process those strings that this worker thread was assigned to - this allows us to manipulate multiple trees in parallel with no worries about synchronization.
         if (m_hash_thread_index.size() && (m_hash_thread_index[h] != thread_index))
         {
            fill_lookahead_pos++;
            fill_lookahead_size--;
            fill_dict_size++;
            continue;
         }

         dict_match* pDstMatch = temp_matches;

         uint cur_pos = m_hash[h];
         m_hash[h] = static_cast<uint>(fill_lookahead_pos);

         uint *pLeft = &m_nodes[insert_pos].m_left;
         uint *pRight = &m_nodes[insert_pos].m_right;

         const uint max_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, fill_lookahead_size);
         uint best_match_len = 2;

         const uint8* pIns = &pDict[insert_pos];

         uint n = m_max_probes;
         for ( ; ; )
         {
            uint delta_pos = fill_lookahead_pos - cur_pos;
            if ((n-- == 0) || (!delta_pos) || (delta_pos >= fill_dict_size))
            {
               *pLeft = 0;
               *pRight = 0;
               break;
            }

            uint pos = cur_pos & m_max_dict_size_mask;
            node *pNode = &m_nodes[pos];

            // Unfortunately, the initial compare match_len must be 2 because of the way we truncate matches at the end of each block.
            uint match_len = 0;
            const uint8* pComp = &pDict[pos];

#if LZHAM_PLATFORM_X360
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
#else
            // Compare a qword at a time for a bit more efficiency.
            const uint64* pComp_end = reinterpret_cast<const uint64*>(pComp + max_match_len - 7);
            const uint64* pComp_cur = reinterpret_cast<const uint64*>(pComp);
            const uint64* pIns_cur = reinterpret_cast<const uint64*>(pIns);
            while (pComp_cur < pComp_end)
            {
               if (*pComp_cur != *pIns_cur)
                  break;
               pComp_cur++;
               pIns_cur++;
            }
            uint alt_match_len = static_cast<uint>(reinterpret_cast<const uint8*>(pComp_cur) - reinterpret_cast<const uint8*>(pComp));
            for ( ; alt_match_len < max_match_len; alt_match_len++)
               if (pComp[alt_match_len] != pIns[alt_match_len])
                  break;
#ifdef LZVERIFY
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
            LZHAM_VERIFY(alt_match_len == match_len);
#endif
            match_len = alt_match_len;
#endif

            if (match_len > best_match_len)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;

               best_match_len = match_len;

               if (match_len == max_match_len)
               {
                  *pLeft = pNode->m_left;
                  *pRight = pNode->m_right;
                  break;
               }
            }
            else if (m_all_matches)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;
            }
            else if ((best_match_len > 2) && (best_match_len == match_len))
            {
               uint bestMatchDist = pDstMatch[-1].m_dist;
               uint compMatchDist = delta_pos;

               uint bestMatchSlot, bestMatchSlotOfs;
               m_pLZBase->compute_lzx_position_slot(bestMatchDist, bestMatchSlot, bestMatchSlotOfs);

               uint compMatchSlot, compMatchOfs;
               m_pLZBase->compute_lzx_position_slot(compMatchDist, compMatchSlot, compMatchOfs);

               // If both matches uses the same match slot, choose the one with the offset containing the lowest nibble as these bits separately entropy coded.
               // This could choose a match which is further away in the absolute sense, but closer in a coding sense.
               if ( (compMatchSlot < bestMatchSlot) ||
                  ((compMatchSlot >= 8) && (compMatchSlot == bestMatchSlot) && ((compMatchOfs & 15) < (bestMatchSlotOfs & 15))) )
               {
                  LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                  pDstMatch[-1].m_dist = delta_pos;
               }
               else if ((match_len < max_match_len) && (compMatchSlot <= bestMatchSlot))
               {
                  // Choose the match which has lowest hamming distance in the mismatch byte for a tiny win on binary files.
                  // TODO: This competes against the prev. optimization.
                  uint desired_mismatch_byte = pIns[match_len];

                  uint cur_mismatch_byte = pDict[(insert_pos - bestMatchDist + match_len) & m_max_dict_size_mask];
                  uint cur_mismatch_dist = g_hamming_dist[cur_mismatch_byte ^ desired_mismatch_byte];

                  uint new_mismatch_byte = pComp[match_len];
                  uint new_mismatch_dist = g_hamming_dist[new_mismatch_byte ^ desired_mismatch_byte];
                  if (new_mismatch_dist < cur_mismatch_dist)
                  {
                     LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                     pDstMatch[-1].m_dist = delta_pos;
                  }
               }
            }

            uint new_pos;
            if (pComp[match_len] < pIns[match_len])
            {
               *pLeft = cur_pos;
               pLeft = &pNode->m_right;
               new_pos = pNode->m_right;
            }
            else
            {
               *pRight = cur_pos;
               pRight = &pNode->m_left;
               new_pos = pNode->m_left;
            }
            if (new_pos == cur_pos)
               break;
            cur_pos = new_pos;
         }

         const uint num_matches = (uint)(pDstMatch - temp_matches);

         if (num_matches)
         {
            pDstMatch[-1].m_dist |= 0x80000000;

            const uint num_matches_to_write = LZHAM_MIN(num_matches, m_max_matches);

            const uint match_ref_ofs = atomic_exchange_add(&m_next_match_ref, num_matches_to_write);

            memcpy(&m_matches[match_ref_ofs],
                   temp_matches + (num_matches - num_matches_to_write),
                   sizeof(temp_matches[0]) * num_matches_to_write);

            // FIXME: This is going to really hurt on platforms requiring export barriers.
            LZHAM_MEMORY_EXPORT_BARRIER

            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], match_ref_ofs);
         }
         else
         {
            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);
         }

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }

      while (fill_lookahead_size)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
         m_nodes[insert_pos].m_left = 0;
         m_nodes[insert_pos].m_right = 0;

         atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }
      
      atomic_increment32(&m_num_completed_helper_threads);
   }